

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getdelegate(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  SQInteger this;
  SQObjectPtr local_38;
  SQObjectPtr *local_28;
  SQObjectPtr *self;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  self = (SQObjectPtr *)idx;
  idx_local = (SQInteger)v;
  local_28 = stack_get(v,idx);
  this = idx_local;
  SVar1 = (local_28->super_SQObject)._type;
  if ((SVar1 == OT_TABLE) || (SVar1 == OT_USERDATA)) {
    if ((((local_28->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate == (SQTable *)0x0)
    {
      SQVM::PushNull((SQVM *)idx_local);
    }
    else {
      SQObjectPtr::SQObjectPtr(&local_38,((local_28->super_SQObject)._unVal.pDelegable)->_delegate);
      SQVM::Push((SQVM *)this,&local_38);
      SQObjectPtr::~SQObjectPtr(&local_38);
    }
    v_local = (HSQUIRRELVM)0x0;
  }
  else {
    v_local = (HSQUIRRELVM)sq_throwerror((HSQUIRRELVM)idx_local,"wrong type");
  }
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_getdelegate(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self=stack_get(v,idx);
    switch(sq_type(self)){
    case OT_TABLE:
    case OT_USERDATA:
        if(!_delegable(self)->_delegate){
            v->PushNull();
            break;
        }
        v->Push(SQObjectPtr(_delegable(self)->_delegate));
        break;
    default: return sq_throwerror(v,_SC("wrong type")); break;
    }
    return SQ_OK;

}